

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

void ensureStringBufferCanHold(DString *baseString,size_t newStringSize)

{
  char *pcVar1;
  char *temp;
  size_t newBufferSize;
  size_t newBufferSizeNeeded;
  size_t newStringSize_local;
  DString *baseString_local;
  
  if ((baseString != (DString *)0x0) &&
     ((char *)baseString->currentStringBufferSize < (char *)(newStringSize + 1))) {
    temp = (char *)baseString->currentStringBufferSize;
    while (temp < (char *)(newStringSize + 1)) {
      if (temp < (char *)0x6400001) {
        temp = (char *)((long)temp << 1);
      }
      else {
        temp = temp + 0x6400000;
      }
    }
    pcVar1 = (char *)realloc(baseString->str,(size_t)temp);
    if (pcVar1 == (char *)0x0) {
      fprintf(_stderr,"Error reallocating memory for d_string. Current buffer size %lu.\n",
              baseString->currentStringBufferSize);
      exit(1);
    }
    baseString->str = pcVar1;
    baseString->currentStringBufferSize = (unsigned_long)temp;
  }
  return;
}

Assistant:

static void ensureStringBufferCanHold(DString * baseString, size_t newStringSize) {
	if (baseString) {
		size_t newBufferSizeNeeded = newStringSize + 1;

		if (newBufferSizeNeeded > baseString->currentStringBufferSize) {
			size_t newBufferSize = baseString->currentStringBufferSize;

			while (newBufferSizeNeeded > newBufferSize) {
				if (newBufferSize > kStringBufferMaxIncrement) {
					newBufferSize += kStringBufferMaxIncrement;
				} else {
					newBufferSize *= kStringBufferGrowthMultiplier;
				}
			}

			char * temp;
			temp = realloc(baseString->str, newBufferSize);

			if (temp == NULL) {
				/* realloc failed */
				fprintf(stderr, "Error reallocating memory for d_string. Current buffer size %lu.\n", baseString->currentStringBufferSize);

				exit(1);
			}

			baseString->str = temp;
			baseString->currentStringBufferSize = newBufferSize;
		}
	}
}